

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::generateLogon(Session *this)

{
  SessionState *this_00;
  bool bVar1;
  SEQNUM value;
  allocator<char> local_1e1;
  FieldBase local_1e0;
  STRING local_188;
  Message logon;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"A",&local_1e1);
  MsgType::MsgType((MsgType *)&local_1e0,&local_188);
  newMessage(&logon,this,(MsgType *)&local_1e0);
  FieldBase::~FieldBase(&local_1e0);
  std::__cxx11::string::~string((string *)&local_188);
  EncryptMethod::EncryptMethod((EncryptMethod *)&local_1e0,0);
  FieldMap::setField(&logon.super_FieldMap,&local_1e0,true);
  FieldBase::~FieldBase(&local_1e0);
  FieldMap::setField(&logon.super_FieldMap,(FieldBase *)&(this->m_state).m_heartBtInt,true);
  if ((this->m_sessionID).m_isFIXT == true) {
    DefaultApplVerID::DefaultApplVerID
              ((DefaultApplVerID *)&local_1e0,&this->m_senderDefaultApplVerID);
    FieldMap::setField(&logon.super_FieldMap,&local_1e0,true);
    FieldBase::~FieldBase(&local_1e0);
  }
  this_00 = &this->m_state;
  if (this->m_refreshOnLogon == true) {
    SessionState::refresh(this_00);
  }
  if (this->m_resetOnLogon == true) {
    std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_1e0,&this->m_timestamper)
    ;
    SessionState::reset(this_00,(UtcTimeStamp *)&local_1e0);
  }
  bVar1 = shouldSendReset(this);
  if (bVar1) {
    local_188._M_dataplus._M_p._0_1_ = 1;
    ResetSeqNumFlag::ResetSeqNumFlag((ResetSeqNumFlag *)&local_1e0,(BOOLEAN *)&local_188);
    FieldMap::setField(&logon.super_FieldMap,&local_1e0,true);
    FieldBase::~FieldBase(&local_1e0);
  }
  if (this->m_sendNextExpectedMsgSeqNum == true) {
    value = SessionState::getNextTargetMsgSeqNum(this_00);
    NextExpectedMsgSeqNum::NextExpectedMsgSeqNum((NextExpectedMsgSeqNum *)&local_1e0,value);
    FieldMap::setField(&logon.super_FieldMap,&local_1e0,true);
    FieldBase::~FieldBase(&local_1e0);
  }
  fill(this,&logon.m_header);
  std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_1e0,&this->m_timestamper);
  (this->m_state).m_lastReceivedTime.super_DateTime.m_date = local_1e0.m_tag;
  *(undefined4 *)&(this->m_state).m_lastReceivedTime.super_DateTime.field_0xc = local_1e0._12_4_;
  (this->m_state).m_lastReceivedTime.super_DateTime.m_time =
       (int64_t)local_1e0.m_string._M_dataplus._M_p;
  (this->m_state).m_testRequest = 0;
  (this->m_state).m_sentLogon = true;
  sendRaw(this,&logon,0);
  Message::~Message(&logon);
  return;
}

Assistant:

void Session::generateLogon() {
  Message logon = newMessage(MsgType(MsgType_Logon));

  logon.setField(EncryptMethod(0));
  logon.setField(m_state.heartBtInt());
  if (m_sessionID.isFIXT()) {
    logon.setField(DefaultApplVerID(m_senderDefaultApplVerID));
  }
  if (m_refreshOnLogon) {
    refresh();
  }
  if (m_resetOnLogon) {
    m_state.reset(m_timestamper());
  }
  if (shouldSendReset()) {
    logon.setField(ResetSeqNumFlag(true));
  }
  if (m_sendNextExpectedMsgSeqNum) {
    logon.setField(NextExpectedMsgSeqNum(getExpectedTargetNum()));
  }

  fill(logon.getHeader());
  m_state.lastReceivedTime(m_timestamper());
  m_state.testRequest(0);
  m_state.sentLogon(true);
  sendRaw(logon);
}